

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image_utils.cpp
# Opt level: O0

void crnlib::image_utils::renorm_normal_map(image_u8 *img)

{
  uint uVar1;
  float *pfVar2;
  uchar *puVar3;
  image<crnlib::color_quad<unsigned_char,_int>_> *in_RDI;
  float fVar4;
  double dVar5;
  uint i;
  float length;
  vec3F v;
  color_quad_u8 *c;
  uint x;
  uint y;
  float in_stack_ffffffffffffffb8;
  float in_stack_ffffffffffffffbc;
  uint alpha;
  uint blue;
  float in_stack_ffffffffffffffc8;
  float in_stack_ffffffffffffffcc;
  vec<3U,_float> *in_stack_ffffffffffffffd0;
  vec<3U,_float> local_24;
  color_quad<unsigned_char,_int> *local_18;
  uint local_10;
  uint local_c;
  image<crnlib::color_quad<unsigned_char,_int>_> *local_8;
  
  local_c = 0;
  local_8 = in_RDI;
  while (blue = local_c, uVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::get_height(local_8)
        , blue < uVar1) {
    local_10 = 0;
    while (alpha = local_10,
          uVar1 = image<crnlib::color_quad<unsigned_char,_int>_>::get_width(local_8), alpha < uVar1)
    {
      local_18 = image<crnlib::color_quad<unsigned_char,_int>_>::operator()
                           (local_8,local_10,local_c);
      if ((((local_18->field_0).field_0.r != 0x80) || ((local_18->field_0).field_0.g != 0x80)) ||
         ((local_18->field_0).field_0.b != 0x80)) {
        vec<3U,_float>::vec((vec<3U,_float> *)CONCAT44(blue,alpha),in_stack_ffffffffffffffbc,
                            in_stack_ffffffffffffffb8,0.0);
        vec<3U,_float>::operator*=(&local_24,0.003921569);
        vec<3U,_float>::operator*=(&local_24,2.0);
        vec<3U,_float>::vec((vec<3U,_float> *)CONCAT44(blue,alpha),in_stack_ffffffffffffffbc);
        vec<3U,_float>::operator-=(&local_24,(vec<3U,_float> *)&stack0xffffffffffffffd0);
        vec<3U,_float>::clamp
                  (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
        in_stack_ffffffffffffffcc = vec<3U,_float>::length((vec<3U,_float> *)0x12c2c3);
        if (0.077 <= in_stack_ffffffffffffffcc) {
          dVar5 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffffcc - 1.0));
          if (0.077 < SUB84(dVar5,0)) {
            if ((in_stack_ffffffffffffffcc != 0.0) || (NAN(in_stack_ffffffffffffffcc))) {
              vec<3U,_float>::operator/=(&local_24,in_stack_ffffffffffffffcc);
            }
            for (in_stack_ffffffffffffffc8 = 0.0; (uint)in_stack_ffffffffffffffc8 < 3;
                in_stack_ffffffffffffffc8 = (float)((int)in_stack_ffffffffffffffc8 + 1)) {
              pfVar2 = vec<3U,_float>::operator[](&local_24,(uint)in_stack_ffffffffffffffc8);
              in_stack_ffffffffffffffb8 = 255.0;
              dVar5 = std::floor((double)(ulong)(uint)((*pfVar2 + 1.0) * 0.5 * 255.0 + 0.5));
              fVar4 = math::clamp<float>(SUB84(dVar5,0),0.0,in_stack_ffffffffffffffb8);
              in_stack_ffffffffffffffbc =
                   (float)CONCAT13((char)(int)fVar4,SUB43(in_stack_ffffffffffffffbc,0));
              puVar3 = color_quad<unsigned_char,_int>::operator[]
                                 (local_18,(uint)in_stack_ffffffffffffffc8);
              *puVar3 = (uchar)((uint)in_stack_ffffffffffffffbc >> 0x18);
            }
            if (((local_18->field_0).field_0.r == 0x80) && ((local_18->field_0).field_0.g == 0x80))
            {
              if ((local_18->field_0).field_0.b < 0x80) {
                (local_18->field_0).field_0.b = '\0';
              }
              else {
                (local_18->field_0).field_0.b = 0xff;
              }
            }
          }
        }
        else {
          color_quad<unsigned_char,_int>::set
                    ((color_quad<unsigned_char,_int> *)in_stack_ffffffffffffffd0,
                     (int)in_stack_ffffffffffffffcc,(int)in_stack_ffffffffffffffc8,blue,alpha);
        }
      }
      local_10 = local_10 + 1;
    }
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void renorm_normal_map(image_u8& img) {
  for (uint y = 0; y < img.get_height(); y++) {
    for (uint x = 0; x < img.get_width(); x++) {
      color_quad_u8& c = img(x, y);
      if ((c.r == 128) && (c.g == 128) && (c.b == 128))
        continue;

      vec3F v(c.r, c.g, c.b);
      v *= 1.0f / 255.0f;
      v *= 2.0f;
      v -= vec3F(1.0f);
      v.clamp(-1.0f, 1.0f);

      float length = v.length();
      if (length < .077f)
        c.set(128, 128, 128, c.a);
      else if (fabs(length - 1.0f) > .077f) {
        if (length)
          v /= length;

        for (uint i = 0; i < 3; i++)
          c[i] = static_cast<uint8>(math::clamp<float>(floor((v[i] + 1.0f) * .5f * 255.0f + .5f), 0.0f, 255.0f));

        if ((c.r == 128) && (c.g == 128)) {
          if (c.b < 128)
            c.b = 0;
          else
            c.b = 255;
        }
      }
    }
  }
}